

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

String * __thiscall kj::_::PromiseBase::trace(String *__return_storage_ptr__,PromiseBase *this)

{
  PromiseNode *pPVar1;
  TraceBuilder builder;
  void *space [32];
  TraceBuilder local_158;
  String local_140;
  void *local_128 [32];
  void *local_28;
  
  memset(local_128,0,0x100);
  local_158.limit = &local_28;
  pPVar1 = (this->node).ptr;
  local_158.start = local_128;
  local_158.current = local_128;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,&local_158,0);
  TraceBuilder::toString(&local_140,&local_158);
  (__return_storage_ptr__->content).ptr = local_140.content.ptr;
  (__return_storage_ptr__->content).size_ = local_140.content.size_;
  (__return_storage_ptr__->content).disposer = local_140.content.disposer;
  return __return_storage_ptr__;
}

Assistant:

kj::String PromiseBase::trace() {
  void* space[32]{};
  TraceBuilder builder(space);
  node->tracePromise(builder, false);
  return kj::str(builder);
}